

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O3

void __thiscall cxxpool::thread_pool::worker(thread_pool *this)

{
  pointer __x;
  pointer ppVar1;
  bool bVar2;
  _Manager_operation extraout_EDX;
  _Any_data *__x_00;
  undefined1 local_90 [8];
  priority_task task;
  undefined1 local_40 [8];
  unique_lock<std::mutex> task_lock;
  
  task.order_.count_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&this->task_mutex_;
  do {
    detail::priority_task::priority_task((priority_task *)local_90);
    local_40 = (undefined1  [8])
               task.order_.count_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    task_lock._M_device._0_1_ = 0;
    std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_40);
    task_lock._M_device._0_1_ = 1;
LAB_001a899c:
    if (this->paused_ != false) {
LAB_001a89b4:
      std::condition_variable::wait((unique_lock *)&this->task_cond_var_);
      goto LAB_001a899c;
    }
    __x = (this->tasks_).c.
          super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
          ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (this->tasks_).c.
             super__Vector_base<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this->done_ == false) {
      if (__x != ppVar1) goto LAB_001a89c6;
      goto LAB_001a89b4;
    }
    if (__x == ppVar1) {
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
      bVar2 = false;
      goto LAB_001a8a0a;
    }
LAB_001a89c6:
    std::function<void_()>::operator=((function<void_()> *)local_90,&__x->callback_);
    task.callback_._M_invoker = (_Invoker_type)__x->priority_;
    __x_00 = (_Any_data *)&__x->order_;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&task.priority_,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)__x_00);
    std::
    priority_queue<cxxpool::detail::priority_task,_std::vector<cxxpool::detail::priority_task,_std::allocator<cxxpool::detail::priority_task>_>,_std::less<cxxpool::detail::priority_task>_>
    ::pop(&this->tasks_);
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_40);
    if (task.callback_.super__Function_base._M_functor._8_8_ == 0) {
      std::__throw_bad_function_call();
    }
    bVar2 = true;
    (*task.callback_.super__Function_base._M_manager)((_Any_data *)local_90,__x_00,extraout_EDX);
LAB_001a8a0a:
    if (task.priority_ != 0) {
      operator_delete((void *)task.priority_,
                      (long)task.order_.count_.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish - task.priority_);
    }
    if (task.callback_.super__Function_base._M_functor._8_8_ != 0) {
      (*(code *)task.callback_.super__Function_base._M_functor._8_8_)
                ((_Any_data *)local_90,(_Any_data *)local_90,3);
    }
    if (!bVar2) {
      return;
    }
  } while( true );
}

Assistant:

void worker() {
        for (;;) {
            cxxpool::detail::priority_task task;
            {
                std::unique_lock<std::mutex> task_lock(task_mutex_);
                task_cond_var_.wait(task_lock, [this]{
                    return !paused_ && (done_ || !tasks_.empty());
                });
                if (done_ && tasks_.empty())
                    break;
                task = tasks_.top();
                tasks_.pop();
            }
            task();
        }
    }